

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genStructField
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Field field,Schema scope,
          Indent indent)

{
  ushort uVar1;
  char *pcVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  Reader list;
  Reader type;
  Reader value;
  Reader value_00;
  Reader list_00;
  bool bVar5;
  void *pvVar6;
  WirePointer *pWVar7;
  StructDataBitCount SVar8;
  StructPointerCount SVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  StructSchema schema;
  StringTree *extraout_RAX;
  size_t __n;
  long lVar14;
  Branch *pBVar15;
  StringTree *extraout_RAX_00;
  StringTree *pSVar16;
  undefined4 in_register_0000000c;
  unsigned_short *params_1;
  anon_union_8_2_eba6ea51_for_Type_5 params_1_00;
  char *pcVar17;
  ArrayPtr<const_char> *params;
  SegmentReader *pSVar18;
  StructReader *__return_storage_ptr___00;
  char (*in_R8) [2];
  ulong uVar19;
  char *pcVar20;
  anon_union_8_2_eba6ea51_for_Type_5 aVar21;
  long lVar22;
  long lVar23;
  size_t sVar24;
  Reader RVar25;
  Type TVar26;
  CappedArray<char,_8UL> CVar27;
  StringPtr delim;
  Type type_00;
  Iterator end;
  int local_418;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  Branch *local_3c8;
  undefined1 local_3c0 [16];
  char *local_3b0;
  ulong local_3a8;
  StringTree *pSStack_3a0;
  char *pcStack_398;
  undefined8 local_390;
  char *local_380;
  ulong local_378;
  void *local_370;
  CapnpcCapnpMain *local_368;
  Schema local_360;
  ushort local_352;
  undefined1 local_350 [16];
  size_t sStack_340;
  ArrayDisposer *local_338;
  undefined1 local_330 [16];
  ArrayDisposer *local_320;
  undefined1 local_318 [16];
  size_t sStack_308;
  ArrayDisposer *local_300;
  undefined1 local_2f8 [16];
  ArrayDisposer *local_2e8;
  ulong local_2e0;
  undefined1 local_2d8 [40];
  size_t sStack_2b0;
  ArrayDisposer *local_2a8;
  undefined1 local_298 [16];
  size_t sStack_288;
  ArrayDisposer *local_280;
  undefined1 local_278 [16];
  ArrayDisposer *local_268;
  char *local_260;
  ArrayPtr<const_char> local_258;
  char local_248 [8];
  String local_240;
  int local_224;
  int local_220;
  char local_21c [4];
  undefined1 local_218 [16];
  size_t sStack_208;
  ArrayDisposer *local_200;
  undefined1 local_1f8 [16];
  ArrayDisposer *local_1e8;
  undefined1 local_1e0 [16];
  ArrayDisposer *pAStack_1d0;
  ArrayDisposer *local_1c8;
  undefined1 local_1c0 [16];
  ArrayDisposer *local_1b0;
  ArrayPtr<const_char> local_1a8;
  ListReader local_198;
  StructReader local_168;
  StructReader local_138;
  StructReader local_108;
  ListReader local_d8;
  StructReader local_a8;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  pSVar18 = field.proto._reader.segment;
  aVar21 = (anon_union_8_2_eba6ea51_for_Type_5)field.proto._reader.capTable;
  pvVar6 = field.proto._reader.data;
  pWVar7 = field.proto._reader.pointers;
  SVar8 = field.proto._reader.dataSize;
  SVar9 = field.proto._reader.pointerCount;
  iVar13 = field.proto._reader.nestingLimit;
  local_378 = CONCAT44(in_register_0000000c,indent.amount);
  local_368 = this;
  local_360.raw = scope.raw;
  if (0x4f < field.proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      local_3e8 = (undefined1  [16])StructSchema::Field::getType(&field);
      schema = Type::asStruct((Type *)local_3e8);
      local_3e8._8_8_ = aVar21;
      local_3d8._0_8_ = pWVar7;
      local_3e8._0_8_ = pSVar18;
      local_3d8._8_4_ = iVar13;
      if (SVar9 == 0) {
        local_3e8._8_8_ = (RawBrandedSchema *)0x0;
        local_3d8._0_8_ = (WirePointer *)0x0;
        local_3e8._0_8_ = (SegmentReader *)0x0;
        local_3d8._8_4_ = 0x7fffffff;
      }
      RVar25 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3e8,(void *)0x0,0);
      local_380 = RVar25.super_StringPtr.content.ptr;
      local_3d8._0_8_ = (WirePointer *)0x0;
      local_3e8._0_8_ = (SegmentReader *)0x0;
      local_3e8._8_8_ = (RawBrandedSchema *)0x0;
      local_3d8._8_4_ = 0x7fffffff;
      if (1 < SVar9) {
        local_3d8._0_8_ = pWVar7 + 1;
        local_3e8._0_8_ = pSVar18;
        local_3e8._8_8_ = aVar21;
        local_3d8._8_4_ = iVar13;
      }
      params_1 = (unsigned_short *)0x0;
      _::PointerReader::getList(&local_d8,(PointerReader *)local_3e8,INLINE_COMPOSITE,(word *)0x0);
      list.reader.capTable = local_d8.capTable;
      list.reader.segment = local_d8.segment;
      list.reader.ptr = local_d8.ptr;
      list.reader.elementCount = local_d8.elementCount;
      list.reader.step = local_d8.step;
      list.reader.structDataSize = local_d8.structDataSize;
      list.reader.structPointerCount = local_d8.structPointerCount;
      list.reader.elementSize = local_d8.elementSize;
      list.reader._39_1_ = local_d8._39_1_;
      list.reader.nestingLimit = local_d8.nestingLimit;
      list.reader._44_4_ = local_d8._44_4_;
      genAnnotations((StringTree *)local_350,local_368,list,local_360);
      uVar1 = *(ushort *)((long)pvVar6 + 2);
      if (uVar1 == 0) {
        kj::StringTree::concat<>();
      }
      else {
        local_258.ptr = (char *)CONCAT62(local_258.ptr._2_6_,~uVar1);
        kj::strTree<char_const(&)[17],unsigned_short>
                  ((StringTree *)local_318,(kj *)"  # union tag = ",(char (*) [17])&local_258,
                   params_1);
      }
      genStructFields((Array<kj::StringTree> *)local_2d8,local_368,schema,
                      (Indent)((int)local_378 + 2));
      delim.content.size_ = 1;
      delim.content.ptr = "";
      kj::StringTree::StringTree((StringTree *)local_298,(Array<kj::StringTree> *)local_2d8,delim);
      aVar21.schema = (RawBrandedSchema *)(RVar25.super_StringPtr.content.size_ - 1);
      local_240.content.ptr._0_4_ = (undefined4)local_378;
      local_218._0_8_ = "}\n";
      local_218._8_8_ = 2;
      lVar22 = 0;
      lVar23 = 0;
      (__return_storage_ptr__->branches).size_ = 0;
      (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
      *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0
      ;
      (__return_storage_ptr__->text).content.ptr = (char *)0x0;
      (__return_storage_ptr__->text).content.size_ = 0;
      uVar19 = local_378 & 0xffffffff;
      local_3e8._8_8_ = aVar21.schema;
      local_3e8._0_8_ = uVar19;
      local_3d8._8_8_ = local_350._0_8_;
      local_3d8._0_8_ = 7;
      local_3c8 = (Branch *)0x2;
      local_3c0._8_8_ = 1;
      local_3c0._0_8_ = local_318._0_8_;
      local_3b0 = (char *)local_298._0_8_;
      local_3a8 = uVar19;
      pSStack_3a0 = (StringTree *)0x2;
      lVar14 = 0;
      do {
        lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
        lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
        lVar14 = lVar14 + 2;
      } while (lVar14 != 10);
      __return_storage_ptr__->size_ = lVar23 + lVar22;
      lVar14 = 0;
      local_3d8 = ZEXT816(7);
      local_3c8 = (Branch *)0x2;
      local_3c0._0_8_ = 0;
      local_3c0._8_8_ = (ArrayDisposer *)0x1;
      local_3b0 = (char *)0x0;
      pSStack_3a0 = (StringTree *)0x2;
      lVar22 = 0;
      lVar23 = 0;
      do {
        lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
        lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
        lVar14 = lVar14 + 2;
      } while (lVar14 != 10);
      kj::heapString((String *)local_1e0,lVar23 + lVar22);
      (__return_storage_ptr__->text).content.ptr = (char *)local_1e0._0_8_;
      (__return_storage_ptr__->text).content.size_ = local_1e0._8_8_;
      (__return_storage_ptr__->text).content.disposer = pAStack_1d0;
      lVar14 = 0;
      lVar22 = 0;
      lVar23 = 0;
      local_3e8._0_2_ = VOID;
      local_3e8[2] = '\0';
      local_3e8[3] = false;
      local_3e8._4_2_ = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      local_3e8._6_2_ = 0;
      local_3e8._8_8_ = (anon_union_8_2_eba6ea51_for_Type_5)0x0;
      local_3d8 = ZEXT816(1) << 0x40;
      local_3c8 = (Branch *)0x0;
      local_3c0 = ZEXT816(1);
      local_3b0 = (char *)0x1;
      local_3a8 = 0;
      pSStack_3a0 = (StringTree *)0x0;
      do {
        lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
        lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
        lVar14 = lVar14 + 2;
      } while (lVar14 != 10);
      sVar24 = lVar23 + lVar22;
      pBVar15 = (Branch *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x40,sVar24,sVar24,
                           kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                           ::construct,
                           kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                           ::destruct);
      (__return_storage_ptr__->branches).ptr = pBVar15;
      (__return_storage_ptr__->branches).size_ = sVar24;
      (__return_storage_ptr__->branches).disposer =
           (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      pcVar17 = (char *)local_1e0._0_8_;
      if ((char *)local_1e0._8_8_ == (char *)0x0) {
        pcVar17 = (char *)0x0;
      }
      if ((int)local_378 != 0) {
        memset(pcVar17,0x20,uVar19);
        pcVar17 = pcVar17 + uVar19;
      }
      if (aVar21.schema != (RawBrandedSchema *)0x0) {
        memcpy(pcVar17,local_380,aVar21.scopeId);
        pcVar17 = pcVar17 + (long)aVar21.schema;
      }
      builtin_strncpy(pcVar17," :group",7);
      pcVar20 = (char *)local_1e0._0_8_;
      if ((char *)local_1e0._8_8_ == (char *)0x0) {
        pcVar20 = (char *)0x0;
      }
      pBVar15->index = (size_t)(pcVar17 + (7 - (long)pcVar20));
      (pBVar15->content).size_ = local_350._0_8_;
      pcVar2 = (pBVar15->content).text.content.ptr;
      if (pcVar2 != (char *)0x0) {
        sVar24 = (pBVar15->content).text.content.size_;
        (pBVar15->content).text.content.ptr = (char *)0x0;
        (pBVar15->content).text.content.size_ = 0;
        pAVar3 = (pBVar15->content).text.content.disposer;
        (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar2,1,sVar24,sVar24,0);
      }
      (pBVar15->content).text.content.ptr = (char *)local_350._8_8_;
      (pBVar15->content).text.content.size_ = sStack_340;
      (pBVar15->content).text.content.disposer = local_338;
      stack0xfffffffffffffcb8 = (undefined1  [16])0x0;
      pBVar4 = (pBVar15->content).branches.ptr;
      if (pBVar4 != (Branch *)0x0) {
        sVar24 = (pBVar15->content).branches.size_;
        (pBVar15->content).branches.ptr = (Branch *)0x0;
        (pBVar15->content).branches.size_ = 0;
        pAVar3 = (pBVar15->content).branches.disposer;
        (*(code *)**(undefined8 **)pAVar3)
                  (pAVar3,pBVar4,0x40,sVar24,sVar24,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      (pBVar15->content).branches.ptr = (Branch *)local_330._0_8_;
      (pBVar15->content).branches.size_ = local_330._8_8_;
      (pBVar15->content).branches.disposer = local_320;
      local_330 = (undefined1  [16])0x0;
      pcVar17[7] = ' ';
      pcVar17[8] = '{';
      pBVar15[1].index = (size_t)(pcVar17 + (9 - (long)pcVar20));
      pBVar15[1].content.size_ = local_318._0_8_;
      pcVar20 = pBVar15[1].content.text.content.ptr;
      if (pcVar20 != (char *)0x0) {
        sVar24 = pBVar15[1].content.text.content.size_;
        pBVar15[1].content.text.content.ptr = (char *)0x0;
        pBVar15[1].content.text.content.size_ = 0;
        pAVar3 = pBVar15[1].content.text.content.disposer;
        (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar20,1,sVar24,sVar24,0);
      }
      pBVar15[1].content.text.content.ptr = (char *)local_318._8_8_;
      pBVar15[1].content.text.content.size_ = sStack_308;
      pBVar15[1].content.text.content.disposer = local_300;
      stack0xfffffffffffffcf0 = (undefined1  [16])0x0;
      pBVar4 = pBVar15[1].content.branches.ptr;
      if (pBVar4 != (Branch *)0x0) {
        sVar24 = pBVar15[1].content.branches.size_;
        pBVar15[1].content.branches.ptr = (Branch *)0x0;
        pBVar15[1].content.branches.size_ = 0;
        pAVar3 = pBVar15[1].content.branches.disposer;
        (*(code *)**(undefined8 **)pAVar3)
                  (pAVar3,pBVar4,0x40,sVar24,sVar24,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pBVar15[1].content.branches.ptr = (Branch *)local_2f8._0_8_;
      pBVar15[1].content.branches.size_ = local_2f8._8_8_;
      pBVar15[1].content.branches.disposer = local_2e8;
      local_2f8 = (undefined1  [16])0x0;
      pcVar17[9] = '\n';
      kj::StringTree::fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
                (__return_storage_ptr__,pcVar17 + 10,2,(StringTree *)local_298,(Indent *)&local_240,
                 (ArrayPtr<const_char> *)local_218);
      uVar10 = local_278._0_8_;
      pSVar16 = extraout_RAX;
      if ((Branch *)local_278._0_8_ != (Branch *)0x0) {
        uVar11 = local_278._8_8_;
        local_278 = (undefined1  [16])0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_268)
                            (local_268,uVar10,0x40,uVar11,uVar11,
                             kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      uVar10 = local_298._8_8_;
      if ((char *)local_298._8_8_ != (char *)0x0) {
        sVar24 = sStack_288;
        stack0xfffffffffffffd70 = (undefined1  [16])0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_280)(local_280,uVar10,1,sVar24,sVar24,0);
      }
      uVar11 = local_2d8._8_8_;
      uVar10 = local_2d8._0_8_;
      if ((StringTree *)local_2d8._0_8_ != (StringTree *)0x0) {
        local_2d8._0_8_ = (StringTree *)0x0;
        local_2d8._8_8_ = (char *)0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_2d8._16_8_)
                            (local_2d8._16_8_,uVar10,0x38,uVar11,uVar11,
                             kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      uVar10 = local_2f8._0_8_;
      if ((Branch *)local_2f8._0_8_ != (Branch *)0x0) {
        uVar11 = local_2f8._8_8_;
        local_2f8 = (undefined1  [16])0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_2e8)
                            (local_2e8,uVar10,0x40,uVar11,uVar11,
                             kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      uVar10 = local_318._8_8_;
      if ((char *)local_318._8_8_ != (char *)0x0) {
        sVar24 = sStack_308;
        stack0xfffffffffffffcf0 = (undefined1  [16])0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_300)(local_300,uVar10,1,sVar24,sVar24,0);
      }
      uVar10 = local_330._0_8_;
      if ((Branch *)local_330._0_8_ != (Branch *)0x0) {
        uVar11 = local_330._8_8_;
        local_330 = (undefined1  [16])0x0;
        pSVar16 = (StringTree *)
                  (*(code *)**(undefined8 **)local_320)
                            (local_320,uVar10,0x40,uVar11,uVar11,
                             kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      uVar10 = local_350._8_8_;
      if ((char *)local_350._8_8_ == (char *)0x0) {
        return pSVar16;
      }
      sVar24 = sStack_340;
      stack0xfffffffffffffcb8 = (undefined1  [16])0x0;
      pSVar16 = (StringTree *)
                (*(code *)**(undefined8 **)local_338)(local_338,uVar10,1,sVar24,sVar24,0);
      return pSVar16;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) {
      pSVar16 = kj::StringTree::concat<>();
      return pSVar16;
    }
  }
  local_418 = 0;
  if (field.proto._reader.pointerCount < 3) {
    local_3d8._8_4_ = 0x7fffffff;
    local_3e8._8_8_ = (RawBrandedSchema *)0x0;
    local_3d8._0_8_ = (WirePointer *)0x0;
    local_3e8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_3d8._0_8_ = field.proto._reader.pointers + 2;
    local_3e8._8_8_ = field.proto._reader.capTable;
    local_3e8._0_8_ = field.proto._reader.segment;
    local_3d8._8_4_ = field.proto._reader.nestingLimit;
  }
  _::PointerReader::getStruct(&local_108,(PointerReader *)local_3e8,(word *)0x0);
  bVar5 = false;
  if (local_108.dataSize < 0x10) goto LAB_00141bdf;
  switch(*local_108.data) {
  case 1:
    local_418 = 1;
    break;
  case 2:
  case 6:
    local_418 = 8;
    break;
  case 3:
  case 7:
  case 0xf:
    local_418 = 0x10;
    break;
  case 4:
  case 8:
  case 10:
    local_418 = 0x20;
    break;
  case 5:
  case 9:
  case 0xb:
    local_418 = 0x40;
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
    local_418 = -1;
    bVar5 = true;
    goto LAB_00141bdf;
  default:
    bVar5 = false;
    local_418 = 0;
    goto LAB_00141bdf;
  }
  bVar5 = false;
LAB_00141bdf:
  local_370 = pvVar6;
  local_3e8._8_8_ = aVar21;
  local_3d8._0_8_ = pWVar7;
  local_3e8._0_8_ = pSVar18;
  local_3d8._8_4_ = iVar13;
  if (SVar9 == 0) {
    local_3e8._8_8_ = (RawBrandedSchema *)0x0;
    local_3d8._0_8_ = (WirePointer *)0x0;
    local_3e8._0_8_ = (SegmentReader *)0x0;
    local_3d8._8_4_ = 0x7fffffff;
  }
  local_2e0 = 0;
  RVar25 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_3e8,(void *)0x0,0);
  local_260 = RVar25.super_StringPtr.content.ptr;
  if (0x6f < SVar8) {
    local_2e0 = (ulong)*(ushort *)((long)local_370 + 0xc);
  }
  if (SVar9 < 3) {
    local_3e8._8_8_ = (RawBrandedSchema *)0x0;
    local_3d8._8_4_ = 0x7fffffff;
    local_3d8._0_8_ = (WirePointer *)0x0;
    local_3e8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_3d8._0_8_ = pWVar7 + 2;
    local_3e8._8_8_ = aVar21;
    local_3e8._0_8_ = pSVar18;
    local_3d8._8_4_ = iVar13;
  }
  _::PointerReader::getStruct(&local_a8,(PointerReader *)local_3e8,(word *)0x0);
  local_78.ptr.isSet = false;
  type._reader.capTable = local_a8.capTable;
  type._reader.segment = local_a8.segment;
  type._reader.data = local_a8.data;
  type._reader.pointers = local_a8.pointers;
  type._reader.dataSize = local_a8.dataSize;
  type._reader.pointerCount = local_a8.pointerCount;
  type._reader._38_2_ = local_a8._38_2_;
  type._reader.nestingLimit = local_a8.nestingLimit;
  type._reader._44_4_ = local_a8._44_4_;
  genType((StringTree *)local_298,local_368,type,local_360,&local_78);
  if (SVar9 < 4) {
    local_3d8._8_4_ = 0x7fffffff;
    local_3e8._8_8_ = (RawBrandedSchema *)0x0;
    local_3d8._0_8_ = (WirePointer *)0x0;
    local_3e8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_3d8._0_8_ = pWVar7 + 3;
    local_3e8._8_8_ = aVar21;
    local_3e8._0_8_ = pSVar18;
    local_3d8._8_4_ = iVar13;
  }
  __return_storage_ptr___00 = &local_138;
  _::PointerReader::getStruct(__return_storage_ptr___00,(PointerReader *)local_3e8,(word *)0x0);
  value._reader.capTable = local_138.capTable;
  value._reader.segment = local_138.segment;
  value._reader.data = local_138.data;
  value._reader.pointers = local_138.pointers;
  value._reader.dataSize = local_138.dataSize;
  value._reader.pointerCount = local_138.pointerCount;
  value._reader._38_2_ = local_138._38_2_;
  value._reader.nestingLimit = local_138.nestingLimit;
  value._reader._44_4_ = local_138._44_4_;
  bVar12 = isEmptyValue((CapnpcCapnpMain *)__return_storage_ptr___00,value);
  local_380 = (char *)CONCAT71(local_380._1_7_,bVar12);
  if (bVar12) {
    local_3e8._0_8_ = "";
    local_3e8._8_8_ = (RawBrandedSchema *)0x0;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>
              ((StringTree *)local_350,(StringTree *)local_3e8,params);
  }
  else {
    TVar26 = StructSchema::Field::getType(&field);
    type_00._0_8_ = TVar26.field_4;
    if (SVar9 < 4) {
      params_1_00.scopeId = 0x7fffffff;
      local_3e8._8_8_ = (RawBrandedSchema *)0x0;
      local_3d8._0_8_ = (WirePointer *)0x0;
      local_3e8._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_3d8._0_8_ = pWVar7 + 3;
      params_1_00.scopeId._4_4_ = 0;
      params_1_00.scopeId._0_4_ = iVar13;
      local_3e8._8_8_ = aVar21;
      local_3e8._0_8_ = pSVar18;
    }
    local_3d8._8_4_ = (int)params_1_00.scopeId;
    _::PointerReader::getStruct(&local_168,(PointerReader *)local_3e8,(word *)0x0);
    value_00._reader.capTable = local_168.capTable;
    value_00._reader.segment = local_168.segment;
    value_00._reader.data = local_168.data;
    value_00._reader.pointers = local_168.pointers;
    value_00._reader.dataSize = local_168.dataSize;
    value_00._reader.pointerCount = local_168.pointerCount;
    value_00._reader._38_2_ = local_168._38_2_;
    value_00._reader.nestingLimit = local_168.nestingLimit;
    value_00._reader._44_4_ = local_168._44_4_;
    type_00.field_4.schema = params_1_00.schema;
    genValue((StringTree *)local_318,TVar26._0_8_,type_00,value_00);
    local_3e8._0_8_ = " = ";
    local_3e8._8_8_ = (CapTableReader *)0x3;
    kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
              ((StringTree *)local_350,(StringTree *)local_3e8,(ArrayPtr<const_char> *)local_318,
               (StringTree *)params_1_00.schema);
  }
  if (SVar9 < 2) {
    iVar13 = 0x7fffffff;
    aVar21.schema = (RawBrandedSchema *)0x0;
    local_3d8._0_8_ = (WirePointer *)0x0;
    pSVar18 = (SegmentReader *)0x0;
  }
  else {
    local_3d8._0_8_ = pWVar7 + 1;
  }
  local_3e8._8_8_ = aVar21.schema;
  local_3e8._0_8_ = pSVar18;
  local_3d8._8_4_ = iVar13;
  _::PointerReader::getList(&local_198,(PointerReader *)local_3e8,INLINE_COMPOSITE,(word *)0x0);
  list_00.reader.capTable = local_198.capTable;
  list_00.reader.segment = local_198.segment;
  list_00.reader.ptr = local_198.ptr;
  list_00.reader.elementCount = local_198.elementCount;
  list_00.reader.step = local_198.step;
  list_00.reader.structDataSize = local_198.structDataSize;
  list_00.reader.structPointerCount = local_198.structPointerCount;
  list_00.reader.elementSize = local_198.elementSize;
  list_00.reader._39_1_ = local_198._39_1_;
  list_00.reader.nestingLimit = local_198.nestingLimit;
  list_00.reader._44_4_ = local_198._44_4_;
  genAnnotations((StringTree *)local_1e0,local_368,list_00,local_360);
  if (bVar5) {
    local_21c[0] = '\0';
    local_21c[1] = '\0';
    local_21c[2] = '\0';
    local_21c[3] = '\0';
    if (0x3f < SVar8) {
      local_21c = *(char (*) [4])((long)local_370 + 4);
    }
    pcVar17 = "]";
    kj::strTree<char_const(&)[5],unsigned_int,char_const(&)[2]>
              ((StringTree *)local_2d8,(kj *)"ptr[",(char (*) [5])local_21c,(uint *)0x19ebf1,in_R8);
  }
  else {
    if (SVar8 < 0x40) {
      local_224 = 1;
      local_220 = 0;
    }
    else {
      local_220 = *(int *)((long)local_370 + 4) * local_418;
      local_224 = *(int *)((long)local_370 + 4) + 1;
    }
    local_224 = local_224 * local_418;
    pcVar17 = ", ";
    kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
              ((StringTree *)local_2d8,(kj *)"bits[",(char (*) [6])&local_220,(uint *)", ",
               (char (*) [3])&local_224,(uint *)0x19f9a3,(char (*) [2])local_198.segment);
  }
  if ((SVar8 < 0x20) || (*(ushort *)((long)local_370 + 2) == 0)) {
    kj::StringTree::concat<>();
  }
  else {
    local_352 = ~*(ushort *)((long)local_370 + 2);
    kj::strTree<char_const(&)[15],unsigned_short>
              ((StringTree *)local_218,(kj *)", union tag = ",(char (*) [15])&local_352,
               (unsigned_short *)pcVar17);
  }
  CVar27 = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,(unsigned_short)local_2e0);
  local_248 = CVar27.content;
  __n = CVar27.currentSize;
  aVar21.schema = (RawBrandedSchema *)(RVar25.super_StringPtr.content.size_ - 1);
  local_258.ptr = ";  # ";
  local_258.size_ = 5;
  local_1a8.ptr = "\n";
  local_1a8.size_ = 1;
  lVar22 = 0;
  lVar23 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  uVar19 = local_378 & 0xffffffff;
  local_3e8._8_8_ = aVar21.schema;
  local_3e8._0_8_ = uVar19;
  local_3d8._8_8_ = __n;
  local_3d8._0_8_ = 2;
  local_3c8 = (Branch *)0x2;
  local_3b0 = (char *)local_1e0._0_8_;
  local_3a8 = 5;
  pSStack_3a0 = (StringTree *)local_2d8._0_8_;
  pcStack_398 = (char *)local_218._0_8_;
  local_390 = 1;
  lVar14 = 0;
  do {
    lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
    lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
    lVar14 = lVar14 + 2;
  } while (lVar14 != 0xc);
  __return_storage_ptr__->size_ = lVar23 + lVar22;
  local_3d8._0_8_ = 2;
  local_3c8 = (Branch *)0x2;
  lVar22 = 0;
  lVar23 = 0;
  local_3c0 = (undefined1  [16])0x0;
  local_3b0 = (char *)0x0;
  local_3a8 = 5;
  pSStack_3a0 = (StringTree *)0x0;
  pcStack_398 = (char *)0x0;
  local_390 = 1;
  lVar14 = 0;
  do {
    lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
    lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
    lVar14 = lVar14 + 2;
  } while (lVar14 != 0xc);
  kj::heapString(&local_240,lVar23 + lVar22);
  pcVar17 = (char *)CONCAT44(local_240.content.ptr._4_4_,local_240.content.ptr._0_4_);
  (__return_storage_ptr__->text).content.ptr = pcVar17;
  (__return_storage_ptr__->text).content.size_ = local_240.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_240.content.disposer;
  lVar14 = 0;
  local_3c8 = (Branch *)0x0;
  lVar22 = 0;
  lVar23 = 0;
  local_3d8 = (undefined1  [16])0x0;
  local_3e8._0_2_ = VOID;
  local_3e8[2] = '\0';
  local_3e8[3] = false;
  local_3e8._4_2_ = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  local_3e8._6_2_ = 0;
  local_3e8._8_8_ = (anon_union_8_2_eba6ea51_for_Type_5)0x0;
  local_3c0._8_8_ = 1;
  local_3c0._0_8_ = 1;
  local_3b0 = (char *)0x1;
  local_3a8 = 0;
  pSStack_3a0 = (StringTree *)0x1;
  pcStack_398 = (char *)0x1;
  local_390 = 0;
  do {
    lVar22 = lVar22 + *(long *)(local_3e8 + lVar14 * 8);
    lVar23 = lVar23 + *(long *)(local_3e8 + lVar14 * 8 + 8);
    lVar14 = lVar14 + 2;
  } while (lVar14 != 0xc);
  sVar24 = lVar23 + lVar22;
  pBVar15 = (Branch *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0x40,sVar24,sVar24,
                       kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                       construct,
                       kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                       destruct);
  (__return_storage_ptr__->branches).ptr = pBVar15;
  (__return_storage_ptr__->branches).size_ = sVar24;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  if (local_240.content.size_ == 0) {
    pcVar17 = (char *)0x0;
  }
  if ((int)local_378 != 0) {
    memset(pcVar17,0x20,uVar19);
    pcVar17 = pcVar17 + uVar19;
  }
  if (aVar21.schema != (RawBrandedSchema *)0x0) {
    memcpy(pcVar17,local_260,aVar21.scopeId);
    pcVar17 = pcVar17 + (long)aVar21.schema;
  }
  pcVar17[0] = ' ';
  pcVar17[1] = '@';
  pcVar17 = pcVar17 + 2;
  if (__n != 0) {
    memcpy(pcVar17,local_248,__n);
    pcVar17 = pcVar17 + __n;
  }
  pcVar17[0] = ' ';
  pcVar17[1] = ':';
  kj::StringTree::
  fill<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar17 + 2,0,(StringTree *)local_298,(StringTree *)local_350,
             (StringTree *)local_1e0,&local_258,(StringTree *)local_2d8,(StringTree *)local_218,
             &local_1a8);
  uVar10 = local_1f8._0_8_;
  pSVar16 = extraout_RAX_00;
  if ((Branch *)local_1f8._0_8_ != (Branch *)0x0) {
    uVar11 = local_1f8._8_8_;
    local_1f8 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_1e8)
                        (local_1e8,uVar10,0x40,uVar11,uVar11,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar10 = local_218._8_8_;
  if ((char *)local_218._8_8_ != (char *)0x0) {
    sVar24 = sStack_208;
    stack0xfffffffffffffdf0 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_200)(local_200,uVar10,1,sVar24,sVar24,0);
  }
  uVar10 = local_2d8._32_8_;
  if ((Branch *)local_2d8._32_8_ != (Branch *)0x0) {
    sVar24 = sStack_2b0;
    stack0xfffffffffffffd48 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_2a8)
                        (local_2a8,uVar10,0x40,sVar24,sVar24,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar11 = local_2d8._16_8_;
  uVar10 = local_2d8._8_8_;
  if ((char *)local_2d8._8_8_ != (char *)0x0) {
    local_2d8._8_8_ = (char *)0x0;
    local_2d8._16_8_ = (ArrayDisposer *)0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_2d8._24_8_)
                        (local_2d8._24_8_,uVar10,1,uVar11,uVar11,0);
  }
  uVar10 = local_1c0._0_8_;
  if ((Branch *)local_1c0._0_8_ != (Branch *)0x0) {
    uVar11 = local_1c0._8_8_;
    local_1c0 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_1b0)
                        (local_1b0,uVar10,0x40,uVar11,uVar11,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar10 = local_1e0._8_8_;
  if ((char *)local_1e0._8_8_ != (char *)0x0) {
    pAVar3 = pAStack_1d0;
    stack0xfffffffffffffe28 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_1c8)(local_1c8,uVar10,1,pAVar3,pAVar3,0);
  }
  uVar10 = local_330._0_8_;
  if ((Branch *)local_330._0_8_ != (Branch *)0x0) {
    uVar11 = local_330._8_8_;
    local_330 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_320)
                        (local_320,uVar10,0x40,uVar11,uVar11,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar10 = local_350._8_8_;
  if ((char *)local_350._8_8_ != (char *)0x0) {
    sVar24 = sStack_340;
    stack0xfffffffffffffcb8 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_338)(local_338,uVar10,1,sVar24,sVar24,0);
  }
  if ((char)local_380 == '\0') {
    uVar10 = local_2f8._0_8_;
    if ((Branch *)local_2f8._0_8_ != (Branch *)0x0) {
      uVar11 = local_2f8._8_8_;
      local_2f8 = (undefined1  [16])0x0;
      pSVar16 = (StringTree *)
                (*(code *)**(undefined8 **)local_2e8)
                          (local_2e8,uVar10,0x40,uVar11,uVar11,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    uVar10 = local_318._8_8_;
    if ((char *)local_318._8_8_ != (char *)0x0) {
      sVar24 = sStack_308;
      stack0xfffffffffffffcf0 = (undefined1  [16])0x0;
      pSVar16 = (StringTree *)
                (*(code *)**(undefined8 **)local_300)(local_300,uVar10,1,sVar24,sVar24,0);
    }
  }
  uVar10 = local_278._0_8_;
  if ((Branch *)local_278._0_8_ != (Branch *)0x0) {
    uVar11 = local_278._8_8_;
    local_278 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_268)
                        (local_268,uVar10,0x40,uVar11,uVar11,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar10 = local_298._8_8_;
  if ((char *)local_298._8_8_ != (char *)0x0) {
    sVar24 = sStack_288;
    stack0xfffffffffffffd70 = (undefined1  [16])0x0;
    pSVar16 = (StringTree *)
              (*(code *)**(undefined8 **)local_280)(local_280,uVar10,1,sVar24,sVar24,0);
  }
  return pSVar16;
}

Assistant:

kj::StringTree genStructField(StructSchema::Field field, Schema scope, Indent indent) {
    auto proto = field.getProto();
    switch (proto.which()) {
      case schema::Field::SLOT: {
        auto slot = proto.getSlot();
        int size = typeSizeBits(slot.getType());
        return kj::strTree(
            indent, proto.getName(), " @", proto.getOrdinal().getExplicit(),
            " :", genType(slot.getType(), scope, nullptr),
            isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
            genAnnotations(proto.getAnnotations(), scope),
            ";  # ", size == -1 ? kj::strTree("ptr[", slot.getOffset(), "]")
                                : kj::strTree("bits[", slot.getOffset() * size, ", ",
                                              (slot.getOffset() + 1) * size, ")"),
            hasDiscriminantValue(proto)
                ? kj::strTree(", union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n");
      }
      case schema::Field::GROUP: {
        auto group = field.getType().asStruct();
        return kj::strTree(
            indent, proto.getName(),
            " :group", genAnnotations(proto.getAnnotations(), scope), " {",
            hasDiscriminantValue(proto)
                ? kj::strTree("  # union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n",
            genStructFields(group, indent.next()),
            indent, "}\n");
      }
    }
    return kj::strTree();
  }